

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O1

int fd_read(BIO *b,char *out,int outl)

{
  int iVar1;
  ssize_t sVar2;
  int return_value;
  
  sVar2 = read(b->num,out,(long)outl);
  BIO_clear_retry_flags(b);
  return_value = (int)sVar2;
  if (return_value < 1) {
    iVar1 = bio_errno_should_retry(return_value);
    if (iVar1 != 0) {
      BIO_set_retry_read(b);
    }
  }
  return return_value;
}

Assistant:

static int fd_read(BIO *b, char *out, int outl) {
  int ret = 0;

  ret = (int)BORINGSSL_READ(b->num, out, outl);
  BIO_clear_retry_flags(b);
  if (ret <= 0) {
    if (bio_errno_should_retry(ret)) {
      BIO_set_retry_read(b);
    }
  }

  return ret;
}